

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

uint32_t ixgbe_tx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  long *plVar1;
  ushort uVar2;
  long *plVar3;
  long *plVar4;
  uint in_ECX;
  long in_RDX;
  ushort in_SI;
  long in_RDI;
  ixgbe_adv_tx_desc *txd_1;
  pkt_buf *buf_1;
  uint32_t next_index;
  uint32_t sent;
  pkt_buf *buf;
  int32_t i;
  uint32_t status;
  ixgbe_adv_tx_desc *txd;
  int32_t cleanup_to;
  int32_t cleanable;
  uint16_t clean_index;
  ixgbe_tx_queue *queue;
  ixy_device *__mptr;
  ixgbe_device *dev;
  uint local_6c;
  uint local_60;
  uint local_4c;
  int local_48;
  ushort local_42;
  
  plVar3 = (long *)(*(long *)(in_RDI + 0x80) + (long)(int)(uint)in_SI * 0x10);
  local_42 = *(ushort *)((long)plVar3 + 10);
  while( true ) {
    local_48 = (uint)*(ushort *)((long)plVar3 + 0xc) - (uint)local_42;
    if (local_48 < 0) {
      local_48 = (uint)*(ushort *)(plVar3 + 1) + local_48;
    }
    if (local_48 < 0x20) break;
    local_4c = local_42 + 0x1f;
    if (*(ushort *)(plVar3 + 1) <= local_4c) {
      local_4c = local_4c - *(ushort *)(plVar3 + 1);
    }
    if ((*(uint *)(*plVar3 + (long)(int)local_4c * 0x10 + 0xc) & 1) == 0) break;
    for (local_60 = (uint)local_42; pkt_buf_free((pkt_buf *)plVar3[(long)(int)local_60 + 2]),
        local_60 != local_4c; local_60 = local_60 + 1 & *(ushort *)(plVar3 + 1) - 1 & 0xffff) {
    }
    local_42 = (short)local_4c + 1U & (short)plVar3[1] - 1U;
  }
  *(ushort *)((long)plVar3 + 10) = local_42;
  local_6c = 0;
  while ((local_6c < in_ECX &&
         (uVar2 = *(short *)((long)plVar3 + 0xc) + 1U & (short)plVar3[1] - 1U, local_42 != uVar2)))
  {
    plVar1 = *(long **)(in_RDX + (ulong)local_6c * 8);
    plVar3[(ulong)*(ushort *)((long)plVar3 + 0xc) + 2] = (long)plVar1;
    plVar4 = (long *)(*plVar3 + (long)(int)(uint)*(ushort *)((long)plVar3 + 0xc) * 0x10);
    *(ushort *)((long)plVar3 + 0xc) = uVar2;
    *plVar4 = *plVar1 + 0x40;
    *(uint *)(plVar4 + 1) = *(uint *)((long)plVar1 + 0x14) | 0x2b300000;
    *(int *)((long)plVar4 + 0xc) = *(int *)((long)plVar1 + 0x14) << 0xe;
    local_6c = local_6c + 1;
  }
  set_reg32(*(uint8_t **)(in_RDI + 0x70),(uint)in_SI * 0x40 + 0x6018,
            (uint)*(ushort *)((long)plVar3 + 0xc));
  return local_6c;
}

Assistant:

uint32_t ixgbe_tx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	struct ixgbe_tx_queue* queue = ((struct ixgbe_tx_queue*)(dev->tx_queues)) + queue_id;
	// the descriptor is explained in section 7.2.3.2.4
	// we just use a struct copy & pasted from intel, but it basically has two formats (hence a union):
	// 1. the write-back format which is written by the NIC once sending it is finished this is used in step 1
	// 2. the read format which is read by the NIC and written by us, this is used in step 2

	uint16_t clean_index = queue->clean_index; // next descriptor to clean up

	// step 1: clean up descriptors that were sent out by the hardware and return them to the mempool
	// start by reading step 2 which is done first for each packet
	// cleaning up must be done in batches for performance reasons, so this is unfortunately somewhat complicated
	while (true) {
		// figure out how many descriptors can be cleaned up
		int32_t cleanable = queue->tx_index - clean_index; // tx_index is always ahead of clean (invariant of our queue)
		if (cleanable < 0) { // handle wrap-around
			cleanable = queue->num_entries + cleanable;
		}
		if (cleanable < TX_CLEAN_BATCH) {
			break;
		}
		// calculcate the index of the last transcriptor in the clean batch
		// we can't check all descriptors for performance reasons
		int32_t cleanup_to = clean_index + TX_CLEAN_BATCH - 1;
		if (cleanup_to >= queue->num_entries) {
			cleanup_to -= queue->num_entries;
		}
		volatile union ixgbe_adv_tx_desc* txd = queue->descriptors + cleanup_to;
		uint32_t status = txd->wb.status;
		// hardware sets this flag as soon as it's sent out, we can give back all bufs in the batch back to the mempool
		if (status & IXGBE_ADVTXD_STAT_DD) {
			int32_t i = clean_index;
			while (true) {
				struct pkt_buf* buf = queue->virtual_addresses[i];
				pkt_buf_free(buf);
				if (i == cleanup_to) {
					break;
				}
				i = wrap_ring(i, queue->num_entries);
			}
			// next descriptor to be cleaned up is one after the one we just cleaned
			clean_index = wrap_ring(cleanup_to, queue->num_entries);
		} else {
			// clean the whole batch or nothing; yes, this leaves some packets in
			// the queue forever if you stop transmitting, but that's not a real concern
			break;
		}
	}
	queue->clean_index = clean_index;

	// step 2: send out as many of our packets as possible
	uint32_t sent;
	for (sent = 0; sent < num_bufs; sent++) {
		uint32_t next_index = wrap_ring(queue->tx_index, queue->num_entries);
		// we are full if the next index is the one we are trying to reclaim
		if (clean_index == next_index) {
			break;
		}
		struct pkt_buf* buf = bufs[sent];
		// remember virtual address to clean it up later
		queue->virtual_addresses[queue->tx_index] = (void*) buf;
		volatile union ixgbe_adv_tx_desc* txd = queue->descriptors + queue->tx_index;
		queue->tx_index = next_index;
		// NIC reads from here
		txd->read.buffer_addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
		// always the same flags: one buffer (EOP), advanced data descriptor, CRC offload, data length
		txd->read.cmd_type_len =
			IXGBE_ADVTXD_DCMD_EOP | IXGBE_ADVTXD_DCMD_RS | IXGBE_ADVTXD_DCMD_IFCS | IXGBE_ADVTXD_DCMD_DEXT | IXGBE_ADVTXD_DTYP_DATA | buf->size;
		// no fancy offloading stuff - only the total payload length
		// implement offloading flags here:
		// 	* ip checksum offloading is trivial: just set the offset
		// 	* tcp/udp checksum offloading is more annoying, you have to precalculate the pseudo-header checksum
		txd->read.olinfo_status = buf->size << IXGBE_ADVTXD_PAYLEN_SHIFT;
	}
	// send out by advancing tail, i.e., pass control of the bufs to the nic
	// this seems like a textbook case for a release memory order, but Intel's driver doesn't even use a compiler barrier here
	set_reg32(dev->addr, IXGBE_TDT(queue_id), queue->tx_index);
	return sent;
}